

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

model_node_type * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::split_downwards
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          model_node_type *parent,int bucketID,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,bool reuse_model)

{
  int *piVar1;
  longlong *plVar2;
  undefined4 uVar3;
  double dVar4;
  undefined4 uVar5;
  short sVar6;
  data_node_type *old_node;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  model_node_type *parent_00;
  AlexNode<int,_int> **ppAVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  undefined7 in_register_00000089;
  int iVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  new_allocator<alex::AlexNode<int,_int>_*> local_51;
  int local_50;
  undefined4 local_4c;
  uint local_48;
  uint local_44;
  LinearModel<int> *local_40;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000089,reuse_model);
  old_node = (data_node_type *)parent->children_[bucketID];
  piVar1 = &(this->stats_).num_downward_splits;
  *piVar1 = *piVar1 + 1;
  plVar2 = &(this->stats_).num_downward_split_keys;
  *plVar2 = *plVar2 + (long)old_node->num_keys_;
  iVar12 = 1 << (fanout_tree_depth & 0x1fU);
  local_50 = fanout_tree_depth;
  local_38 = used_fanout_tree_nodes;
  parent_00 = (model_node_type *)operator_new(0x40);
  sVar6 = (old_node->super_AlexNode<int,_int>).level_;
  (parent_00->super_AlexNode<int,_int>).is_leaf_ = false;
  (parent_00->super_AlexNode<int,_int>).duplication_factor_ = '\0';
  (parent_00->super_AlexNode<int,_int>).level_ = sVar6;
  local_40 = &(parent_00->super_AlexNode<int,_int>).model_;
  (parent_00->super_AlexNode<int,_int>).cost_ = 0.0;
  (parent_00->super_AlexNode<int,_int>).model_.a_ = 0.0;
  (parent_00->super_AlexNode<int,_int>).model_.b_ = 0.0;
  (parent_00->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00164b98;
  parent_00->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
  parent_00->num_children_ = 0;
  parent_00->children_ = (AlexNode<int,_int> **)0x0;
  (parent_00->super_AlexNode<int,_int>).duplication_factor_ =
       (old_node->super_AlexNode<int,_int>).duplication_factor_;
  parent_00->num_children_ = iVar12;
  ppAVar9 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                      (&local_51,(long)iVar12,(void *)0x0);
  parent_00->children_ = ppAVar9;
  local_44 = (uint)CONCAT71((int7)((ulong)ppAVar9 >> 8),
                            (old_node->super_AlexNode<int,_int>).duplication_factor_);
  iVar11 = 1 << (local_44 & 0x1f);
  iVar13 = bucketID - bucketID % iVar11;
  local_48 = iVar13 + iVar11;
  dVar15 = (parent->super_AlexNode<int,_int>).model_.a_;
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    auVar14 = vpinsrd_avx(ZEXT416(local_48),iVar13,1);
    auVar14 = vcvtdq2pd_avx(auVar14);
    dVar4 = (parent->super_AlexNode<int,_int>).model_.b_;
    auVar7._8_8_ = dVar4;
    auVar7._0_8_ = dVar4;
    auVar14 = vsubpd_avx512vl(auVar14,auVar7);
    auVar17._8_8_ = dVar15;
    auVar17._0_8_ = dVar15;
    auVar14 = vdivpd_avx(auVar14,auVar17);
    auVar7 = vshufpd_avx(auVar14,auVar14,1);
    auVar14 = vhsubpd_avx(auVar14,auVar14);
    dVar15 = (1.0 / auVar14._0_8_) * (double)iVar12;
    local_40->a_ = dVar15;
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar15;
    auVar14 = vxorpd_avx512vl(auVar18,auVar14);
    dVar15 = auVar7._0_8_ * auVar14._0_8_;
  }
  else {
    local_40->a_ = 0.0;
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)iVar13 - (parent->super_AlexNode<int,_int>).model_.b_;
    auVar14 = vxorpd_avx512vl(auVar16,auVar8);
    dVar15 = auVar14._0_8_ / (double)iVar11;
  }
  (parent_00->super_AlexNode<int,_int>).model_.b_ = dVar15;
  if ((local_38->
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (local_38->
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    if (local_50 != 1) {
      __assert_fail("fanout_tree_depth == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x650,
                    "model_node_type *alex::Alex<int, int>::split_downwards(model_node_type *, int, int, std::vector<fanout_tree::FTNode> &, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    create_two_new_data_nodes(this,old_node,parent_00,1,local_4c._0_1_,0);
  }
  else {
    create_new_data_nodes(this,old_node,parent_00,local_50,local_38,0,0);
  }
  delete_node(this,(AlexNode<int,_int> *)old_node);
  uVar3 = (this->stats_).num_model_nodes;
  uVar5 = (this->stats_).num_data_nodes;
  auVar19._4_4_ = uVar5;
  auVar19._0_4_ = uVar3;
  auVar19._8_8_ = 0;
  auVar14 = vpaddd_avx(auVar19,_DAT_0014df30);
  (this->stats_).num_model_nodes = (int)auVar14._0_8_;
  (this->stats_).num_data_nodes = (int)((ulong)auVar14._0_8_ >> 0x20);
  if ((char)local_44 != '\x1f') {
    lVar10 = (long)iVar13;
    do {
      parent->children_[lVar10] = (AlexNode<int,_int> *)parent_00;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)local_48);
  }
  if (this->superroot_ == parent) {
    this->root_node_ = (AlexNode<int,_int> *)parent_00;
    *this->superroot_->children_ = (AlexNode<int,_int> *)parent_00;
    (this->superroot_->super_AlexNode<int,_int>).level_ = this->root_node_->level_ + -1;
  }
  return parent_00;
}

Assistant:

model_node_type* split_downwards(
      model_node_type* parent, int bucketID, int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      bool reuse_model) {
    auto leaf = static_cast<data_node_type*>(parent->children_[bucketID]);
    stats_.num_downward_splits++;
    stats_.num_downward_split_keys += leaf->num_keys_;

    // Create the new model node that will replace the current data node
    int fanout = 1 << fanout_tree_depth;
    auto new_node = new (model_node_allocator().allocate(1))
        model_node_type(leaf->level_, allocator_);
    new_node->duplication_factor_ = leaf->duplication_factor_;
    new_node->num_children_ = fanout;
    new_node->children_ =
        new (pointer_allocator().allocate(fanout)) AlexNode<T, P>*[fanout];

    int repeats = 1 << leaf->duplication_factor_;
    int start_bucketID =
        bucketID - (bucketID % repeats);  // first bucket with same child
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with different child
    if (parent->model_.a_ == 0){
      new_node->model_.a_ = 0;
      new_node->model_.b_ = -1.0 * (start_bucketID - parent->model_.b_) / repeats;
    }
    else{
      double left_boundary_value =
          (start_bucketID - parent->model_.b_) / parent->model_.a_;
      double right_boundary_value =
          (end_bucketID - parent->model_.b_) / parent->model_.a_;
      new_node->model_.a_ =
          1.0 / (right_boundary_value - left_boundary_value) * fanout;
      new_node->model_.b_ = -new_node->model_.a_ * left_boundary_value;
    }

    // Create new data nodes
    if (used_fanout_tree_nodes.empty()) {
      assert(fanout_tree_depth == 1);
      create_two_new_data_nodes(leaf, new_node, fanout_tree_depth, reuse_model);
    } else {
      create_new_data_nodes(leaf, new_node, fanout_tree_depth,
                            used_fanout_tree_nodes);
    }

    delete_node(leaf);
    stats_.num_data_nodes--;
    stats_.num_model_nodes++;
    for (int i = start_bucketID; i < end_bucketID; i++) {
      parent->children_[i] = new_node;
    }
    if (parent == superroot_) {
      root_node_ = new_node;
      update_superroot_pointer();
    }

    return new_node;
  }